

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O0

bool crnlib::prefix_coding::generate_decoder_tables
               (uint num_syms,uint8 *pCodesizes,decoder_tables *pTables,uint table_bits)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  uint32 b;
  uint uVar4;
  uint uVar5;
  unsigned_short *puVar6;
  uint *puVar7;
  byte bVar8;
  uint in_ECX;
  decoder_tables *in_RDX;
  long in_RSI;
  uint in_EDI;
  uint i_5;
  uint i_4;
  uint i_3;
  uint t;
  uint j;
  uint sym_index;
  uint code_1;
  uint val_ptr;
  uint max_code;
  uint min_code;
  uint fillnum;
  uint fillsize;
  uint codesize;
  uint table_size;
  uint sorted_pos;
  uint c_1;
  uint i_2;
  uint n;
  uint i_1;
  uint min_code_size;
  uint max_code_size;
  uint total_used_syms;
  uint code;
  uint sorted_positions [17];
  uint c;
  uint i;
  uint num_codes [17];
  uint min_codes [16];
  uint local_164;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  uint32 in_stack_fffffffffffffeac;
  uint uVar9;
  uint local_14c;
  uint local_134;
  uint local_124;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint auStack_108 [18];
  uint local_c0;
  uint local_bc;
  int local_b8 [20];
  uint auStack_68 [19];
  uint local_1c;
  decoder_tables *local_18;
  long local_10;
  uint local_8;
  bool local_1;
  
  if ((in_EDI == 0) || (0xb < in_ECX)) {
    local_1 = false;
  }
  else {
    in_RDX->m_num_syms = in_EDI;
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_EDI;
    utils::zero_object<unsigned_int[17]>((uint (*) [17])0x244474);
    for (local_bc = 0; local_bc < local_8; local_bc = local_bc + 1) {
      local_c0 = (uint)*(byte *)(local_10 + (ulong)local_bc);
      if (local_c0 != 0) {
        local_b8[local_c0] = local_b8[local_c0] + 1;
      }
    }
    local_10c = 0;
    local_110 = 0;
    local_114 = 0;
    local_118 = 0xffffffff;
    for (local_11c = 1; local_11c < 0x11; local_11c = local_11c + 1) {
      iVar2 = local_b8[local_11c];
      if (iVar2 == 0) {
        local_18->m_max_codes[local_11c - 1] = 0;
      }
      else {
        local_118 = math::minimum<unsigned_int>(local_118,local_11c);
        local_114 = math::maximum<unsigned_int>(local_114,local_11c);
        auStack_68[local_11c - 1] = local_10c;
        local_18->m_max_codes[local_11c - 1] = (local_10c + iVar2) - 1;
        local_18->m_max_codes[local_11c - 1] =
             (local_18->m_max_codes[local_11c - 1] << (0x10U - (char)local_11c & 0x1f) |
             (1 << (0x10U - (char)local_11c & 0x1f)) - 1U) + 1;
        local_18->m_val_ptrs[local_11c - 1] = local_110;
        auStack_108[local_11c] = local_110;
        local_10c = iVar2 + local_10c;
        local_110 = iVar2 + local_110;
      }
      local_10c = local_10c << 1;
    }
    local_18->m_total_used_syms = local_110;
    if (local_18->m_cur_sorted_symbol_order_size < local_110) {
      local_18->m_cur_sorted_symbol_order_size = local_110;
      bVar3 = math::is_power_of_2(local_110);
      uVar5 = local_8;
      if (!bVar3) {
        b = math::next_pow2(local_110);
        uVar4 = math::minimum<unsigned_int>(uVar5,b);
        local_18->m_cur_sorted_symbol_order_size = uVar4;
      }
      if (local_18->m_sorted_symbol_order != (uint16 *)0x0) {
        crnlib_delete_array<unsigned_short>
                  ((unsigned_short *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        local_18->m_sorted_symbol_order = (uint16 *)0x0;
      }
      puVar6 = crnlib_new_array<unsigned_short>(in_stack_fffffffffffffeac);
      local_18->m_sorted_symbol_order = puVar6;
    }
    local_18->m_min_code_size = (uint8)local_118;
    local_18->m_max_code_size = (uint8)local_114;
    for (local_124 = 0; local_124 < local_8; local_124 = local_124 + 1) {
      uVar4 = (uint)*(byte *)(local_10 + (ulong)local_124);
      if (uVar4 != 0) {
        uVar9 = auStack_108[uVar4];
        auStack_108[uVar4] = uVar9 + 1;
        local_18->m_sorted_symbol_order[uVar9] = (uint16)local_124;
      }
    }
    if (local_1c <= local_18->m_min_code_size) {
      local_1c = 0;
    }
    local_18->m_table_bits = local_1c;
    if (local_1c != 0) {
      uVar4 = 1 << ((byte)local_1c & 0x1f);
      if (local_18->m_cur_lookup_size < uVar4) {
        local_18->m_cur_lookup_size = uVar4;
        if (local_18->m_lookup != (uint32 *)0x0) {
          crnlib_delete_array<unsigned_int>
                    ((uint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          local_18->m_lookup = (uint32 *)0x0;
        }
        puVar7 = crnlib_new_array<unsigned_int>(in_stack_fffffffffffffeac);
        local_18->m_lookup = puVar7;
      }
      memset(local_18->m_lookup,0xff,(1L << ((byte)local_1c & 0x3f)) << 2);
      for (local_134 = 1; local_134 <= local_1c; local_134 = local_134 + 1) {
        if (local_b8[local_134] != 0) {
          bVar8 = (char)local_1c - (char)local_134;
          uVar4 = auStack_68[local_134 - 1];
          uVar5 = decoder_tables::get_unshifted_max_code(local_18,local_134);
          iVar2 = local_18->m_val_ptrs[local_134 - 1];
          for (local_14c = uVar4; local_14c <= uVar5; local_14c = local_14c + 1) {
            uVar1 = local_18->m_sorted_symbol_order[(iVar2 + local_14c) - uVar4];
            for (uVar9 = 0; uVar9 < (uint)(1 << (bVar8 & 0x1f)); uVar9 = uVar9 + 1) {
              local_18->m_lookup[uVar9 + (local_14c << (bVar8 & 0x1f))] =
                   (uint)uVar1 | local_134 << 0x10;
            }
          }
        }
      }
    }
    for (uVar4 = 0; uVar4 < 0x10; uVar4 = uVar4 + 1) {
      local_18->m_val_ptrs[uVar4] = local_18->m_val_ptrs[uVar4] - auStack_68[uVar4];
    }
    local_18->m_table_max_code = 0;
    local_18->m_decode_start_code_size = (uint)local_18->m_min_code_size;
    uVar4 = local_1c;
    if (local_1c != 0) {
      for (; uVar4 != 0; uVar4 = uVar4 - 1) {
        if (local_b8[uVar4] != 0) {
          local_18->m_table_max_code = local_18->m_max_codes[uVar4 - 1];
          break;
        }
      }
      if (uVar4 != 0) {
        local_18->m_decode_start_code_size = local_1c + 1;
        do {
          local_164 = local_1c + 1;
          if (local_114 < local_164) goto LAB_00244b11;
          local_1c = local_164;
        } while (local_b8[local_164] == 0);
        local_18->m_decode_start_code_size = local_164;
      }
    }
LAB_00244b11:
    local_18->m_max_codes[0x10] = 0xffffffff;
    local_18->m_val_ptrs[0x10] = 0xfffff;
    local_18->m_table_shift = 0x20 - local_18->m_table_bits;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool generate_decoder_tables(uint num_syms, const uint8* pCodesizes, decoder_tables* pTables, uint table_bits) {
  uint min_codes[cMaxExpectedCodeSize];

  if ((!num_syms) || (table_bits > cMaxTableBits))
    return false;

  pTables->m_num_syms = num_syms;

  uint num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c)
      num_codes[c]++;
  }

  uint sorted_positions[cMaxExpectedCodeSize + 1];

  uint code = 0;

  uint total_used_syms = 0;
  uint max_code_size = 0;
  uint min_code_size = UINT_MAX;
  for (uint i = 1; i <= cMaxExpectedCodeSize; i++) {
    const uint n = num_codes[i];

    if (!n)
      pTables->m_max_codes[i - 1] = 0;  //UINT_MAX;
    else {
      min_code_size = math::minimum(min_code_size, i);
      max_code_size = math::maximum(max_code_size, i);

      min_codes[i - 1] = code;

      pTables->m_max_codes[i - 1] = code + n - 1;
      pTables->m_max_codes[i - 1] = 1 + ((pTables->m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

      pTables->m_val_ptrs[i - 1] = total_used_syms;

      sorted_positions[i] = total_used_syms;

      code += n;
      total_used_syms += n;
    }

    code <<= 1;
  }

  pTables->m_total_used_syms = total_used_syms;

  if (total_used_syms > pTables->m_cur_sorted_symbol_order_size) {
    pTables->m_cur_sorted_symbol_order_size = total_used_syms;

    if (!math::is_power_of_2(total_used_syms))
      pTables->m_cur_sorted_symbol_order_size = math::minimum<uint>(num_syms, math::next_pow2(total_used_syms));

    if (pTables->m_sorted_symbol_order) {
      crnlib_delete_array(pTables->m_sorted_symbol_order);
      pTables->m_sorted_symbol_order = NULL;
    }

    pTables->m_sorted_symbol_order = crnlib_new_array<uint16>(pTables->m_cur_sorted_symbol_order_size);
  }

  pTables->m_min_code_size = static_cast<uint8>(min_code_size);
  pTables->m_max_code_size = static_cast<uint8>(max_code_size);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c) {
      CRNLIB_ASSERT(num_codes[c]);

      uint sorted_pos = sorted_positions[c]++;

      CRNLIB_ASSERT(sorted_pos < total_used_syms);

      pTables->m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
    }
  }

  if (table_bits <= pTables->m_min_code_size)
    table_bits = 0;
  pTables->m_table_bits = table_bits;

  if (table_bits) {
    uint table_size = 1 << table_bits;
    if (table_size > pTables->m_cur_lookup_size) {
      pTables->m_cur_lookup_size = table_size;

      if (pTables->m_lookup) {
        crnlib_delete_array(pTables->m_lookup);
        pTables->m_lookup = NULL;
      }

      pTables->m_lookup = crnlib_new_array<uint32>(table_size);
    }

    memset(pTables->m_lookup, 0xFF, static_cast<uint>(sizeof(pTables->m_lookup[0])) * (1UL << table_bits));

    for (uint codesize = 1; codesize <= table_bits; codesize++) {
      if (!num_codes[codesize])
        continue;

      const uint fillsize = table_bits - codesize;
      const uint fillnum = 1 << fillsize;

      const uint min_code = min_codes[codesize - 1];
      const uint max_code = pTables->get_unshifted_max_code(codesize);
      const uint val_ptr = pTables->m_val_ptrs[codesize - 1];

      for (uint code = min_code; code <= max_code; code++) {
        const uint sym_index = pTables->m_sorted_symbol_order[val_ptr + code - min_code];
        CRNLIB_ASSERT(pCodesizes[sym_index] == codesize);

        for (uint j = 0; j < fillnum; j++) {
          const uint t = j + (code << fillsize);

          CRNLIB_ASSERT(t < (1U << table_bits));

          CRNLIB_ASSERT(pTables->m_lookup[t] == cUINT32_MAX);

          pTables->m_lookup[t] = sym_index | (codesize << 16U);
        }
      }
    }
  }

  for (uint i = 0; i < cMaxExpectedCodeSize; i++)
    pTables->m_val_ptrs[i] -= min_codes[i];

  pTables->m_table_max_code = 0;
  pTables->m_decode_start_code_size = pTables->m_min_code_size;

  if (table_bits) {
    uint i;
    for (i = table_bits; i >= 1; i--) {
      if (num_codes[i]) {
        pTables->m_table_max_code = pTables->m_max_codes[i - 1];
        break;
      }
    }
    if (i >= 1) {
      pTables->m_decode_start_code_size = table_bits + 1;
      for (uint i = table_bits + 1; i <= max_code_size; i++) {
        if (num_codes[i]) {
          pTables->m_decode_start_code_size = i;
          break;
        }
      }
    }
  }

  // sentinels
  pTables->m_max_codes[cMaxExpectedCodeSize] = UINT_MAX;
  pTables->m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

  pTables->m_table_shift = 32 - pTables->m_table_bits;

  return true;
}